

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_secp256k1.cpp
# Opt level: O2

void __thiscall
Secp256k1_AddTweakPubkeySecp256k1EcErrorTest_Test::TestBody
          (Secp256k1_AddTweakPubkeySecp256k1EcErrorTest_Test *this)

{
  pointer paVar1;
  bool bVar2;
  secp256k1_context_struct *context;
  pointer paVar3;
  AssertHelper local_d0;
  Secp256k1 secp;
  ByteData actual;
  TweakPubkeyTestVector test_vector;
  
  context = wally_get_secp_context();
  cfd::core::Secp256k1::Secp256k1(&secp,context);
  paVar1 = tweak_pubkey_error_vectors.
           super__Vector_base<TweakPubkeyTestVector,_std::allocator<TweakPubkeyTestVector>_>._M_impl
           .super__Vector_impl_data._M_finish;
  for (paVar3 = tweak_pubkey_error_vectors.
                super__Vector_base<TweakPubkeyTestVector,_std::allocator<TweakPubkeyTestVector>_>.
                _M_impl.super__Vector_impl_data._M_start; paVar3 != paVar1; paVar3 = paVar3 + 1) {
    anon_struct_120_5_2a4d6406::TweakPubkeyTestVector(&test_vector,paVar3);
    if (test_vector.expect_add._M_string_length == 0) {
      bVar2 = testing::internal::AlwaysTrue();
      if (bVar2) {
        cfd::core::Secp256k1::AddTweakPubkeySecp256k1Ec
                  (&actual,&secp,&test_vector.pubkey,&test_vector.tweak,test_vector.is_check);
        std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                  ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&actual);
      }
      testing::Message::Message((Message *)&actual);
      testing::internal::AssertHelper::AssertHelper
                (&local_d0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_secp256k1.cpp"
                 ,0x108,
                 "Expected: ByteData actual = secp.AddTweakPubkeySecp256k1Ec(test_vector.pubkey, test_vector.tweak, test_vector.is_check) throws an exception of type CfdException.\n  Actual: it throws nothing."
                );
      testing::internal::AssertHelper::operator=(&local_d0,(Message *)&actual);
      testing::internal::AssertHelper::~AssertHelper(&local_d0);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&actual);
    }
    if (test_vector.expect_mul._M_string_length == 0) {
      bVar2 = testing::internal::AlwaysTrue();
      if (bVar2) {
        cfd::core::Secp256k1::MulTweakPubkeySecp256k1Ec
                  (&actual,&secp,&test_vector.pubkey,&test_vector.tweak);
        std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                  ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&actual);
      }
      testing::Message::Message((Message *)&actual);
      testing::internal::AssertHelper::AssertHelper
                (&local_d0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_secp256k1.cpp"
                 ,0x10e,
                 "Expected: ByteData actual = secp.MulTweakPubkeySecp256k1Ec(test_vector.pubkey, test_vector.tweak) throws an exception of type CfdException.\n  Actual: it throws nothing."
                );
      testing::internal::AssertHelper::operator=(&local_d0,(Message *)&actual);
      testing::internal::AssertHelper::~AssertHelper(&local_d0);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&actual);
    }
    anon_struct_120_5_2a4d6406::~TweakPubkeyTestVector(&test_vector);
  }
  return;
}

Assistant:

TEST(Secp256k1, AddTweakPubkeySecp256k1EcErrorTest) {
  struct secp256k1_context_struct *cxt = wally_get_secp_context();
  Secp256k1 secp = Secp256k1(cxt);
  for (TweakPubkeyTestVector test_vector : tweak_pubkey_error_vectors) {
    if (test_vector.expect_add.empty()) {
      EXPECT_THROW(
        ByteData actual = secp.AddTweakPubkeySecp256k1Ec(test_vector.pubkey,
          test_vector.tweak, test_vector.is_check),
        CfdException);
    }
    if (test_vector.expect_mul.empty()) {
      EXPECT_THROW(
        ByteData actual = secp.MulTweakPubkeySecp256k1Ec(test_vector.pubkey,
          test_vector.tweak),
        CfdException);
    }
  }
}